

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsemulatorintegration.cpp
# Opt level: O0

EGLNativeWindowType __thiscall
QEglFSEmulatorIntegration::createNativeWindow
          (QEglFSEmulatorIntegration *this,QPlatformWindow *platformWindow,QSize *size,
          QSurfaceFormat *format)

{
  uint uVar1;
  int iVar2;
  QEglFSEmulatorScreen *this_00;
  long *in_RSI;
  QBasicAtomicInteger<int> *in_RDI;
  QEglFSEmulatorScreen *screen;
  code *in_stack_ffffffffffffffc8;
  
  this_00 = (QEglFSEmulatorScreen *)(**(code **)(*in_RSI + 0x18))();
  if ((this_00 != (QEglFSEmulatorScreen *)0x0) && (*(long *)(in_RDI + 4) != 0)) {
    in_stack_ffffffffffffffc8 = *(code **)(in_RDI + 4);
    uVar1 = QEglFSEmulatorScreen::id(this_00);
    (*in_stack_ffffffffffffffc8)(uVar1);
  }
  iVar2 = QBasicAtomicInteger<int>::fetchAndAddRelaxed
                    (in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  return (long)(iVar2 + 1);
}

Assistant:

EGLNativeWindowType QEglFSEmulatorIntegration::createNativeWindow(QPlatformWindow *platformWindow,
                                                                  const QSize &size,
                                                                  const QSurfaceFormat &format)
{
    Q_UNUSED(size);
    Q_UNUSED(format);
    QEglFSEmulatorScreen *screen = static_cast<QEglFSEmulatorScreen *>(platformWindow->screen());
    if (screen && setDisplay) {
        // Let the emulator know which screen the window surface is attached to
        setDisplay(screen->id());
    }
    Q_CONSTINIT static QBasicAtomicInt uniqueWindowId = Q_BASIC_ATOMIC_INITIALIZER(0);
    return EGLNativeWindowType(qintptr(1 + uniqueWindowId.fetchAndAddRelaxed(1)));
}